

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x2.c
# Opt level: O0

void glmc_mat3x2_zero(vec2 *m)

{
  undefined4 *in_RDI;
  mat3x2 t;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 *local_48;
  
  local_48 = in_RDI;
  memset(&local_68,0,0x18);
  *local_48 = local_68;
  local_48[1] = local_64;
  local_48[2] = local_60;
  local_48[3] = local_5c;
  local_48[4] = local_58;
  local_48[5] = local_54;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x2_zero(mat3x2 m) {
  glm_mat3x2_zero(m);
}